

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdevice.cpp
# Opt level: O0

QList<QMimeType> * __thiscall QPrintDevice::supportedMimeTypes(QPrintDevice *this)

{
  bool bVar1;
  QPlatformPrintDevice *pQVar2;
  QList<QMimeType> *in_RDI;
  QList<QMimeType> *pQVar3;
  
  pQVar3 = in_RDI;
  bVar1 = isValid((QPrintDevice *)in_RDI);
  if (bVar1) {
    pQVar2 = QSharedPointer<QPlatformPrintDevice>::operator->
                       ((QSharedPointer<QPlatformPrintDevice> *)0x13920d);
    (*pQVar2->_vptr_QPlatformPrintDevice[0x25])(in_RDI);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QMimeType>::QList((QList<QMimeType> *)0x139238);
  }
  return pQVar3;
}

Assistant:

QList<QMimeType> QPrintDevice::supportedMimeTypes() const
{
    return isValid() ? d->supportedMimeTypes() : QList<QMimeType>();
}